

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

pair<bool,_Point> intersection(Segment *segment,Triangle *triangle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pair<bool,_Point> pVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  Point PVar8;
  Vector VVar9;
  Vector local_d8;
  Vector local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  Vector local_88;
  Vector local_78;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [24];
  float local_40;
  float local_3c;
  uint local_38;
  undefined8 uStack_34;
  float fStack_2c;
  
  PVar8 = operator-(segment->b,&segment->a);
  local_88.z = PVar8.z;
  local_88._0_8_ = PVar8._0_8_;
  VVar9 = normalize(&local_88);
  local_d8.z = VVar9.z;
  local_d8._0_8_ = VVar9._0_8_;
  local_b8._8_4_ = extraout_XMM0_Dc;
  local_b8._0_4_ = local_d8.x;
  local_b8._4_4_ = local_d8.y;
  local_b8._12_4_ = extraout_XMM0_Dd;
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  local_40 = local_d8.z;
  PVar8 = operator-(triangle->y,&triangle->x);
  local_88.z = PVar8.z;
  local_88._0_8_ = PVar8._0_8_;
  local_58._8_4_ = extraout_XMM0_Dc_00;
  local_58._0_4_ = local_88.x;
  local_58._4_4_ = local_88.y;
  local_58._12_4_ = extraout_XMM0_Dd_00;
  local_68 = local_88.z;
  uStack_64 = uVar4;
  uStack_60 = uVar5;
  uStack_5c = uVar6;
  PVar8 = operator-(triangle->z,&triangle->x);
  local_c8.z = PVar8.z;
  local_c8._0_8_ = PVar8._0_8_;
  local_a8._8_4_ = extraout_XMM0_Dc_01;
  local_a8._0_4_ = local_c8.x;
  local_a8._4_4_ = local_c8.y;
  local_a8._12_4_ = extraout_XMM0_Dd_01;
  local_3c = local_c8.z;
  VVar9 = crossProduct(&local_d8,&local_c8);
  local_68 = local_68 * VVar9.z + (float)local_58._0_4_ * VVar9.x + (float)local_58._4_4_ * VVar9.y;
  if (ABS(local_68) < 1.1920929e-07) {
    local_38 = local_38 & 0xffffff00;
    uStack_34 = 0;
    fStack_2c = 0.0;
  }
  else {
    local_68 = 1.0 / local_68;
    local_98._8_4_ = extraout_XMM0_Dc_02;
    local_98._0_8_ = VVar9._0_8_;
    local_98._12_4_ = extraout_XMM0_Dd_02;
    local_58._0_4_ = VVar9.z;
    PVar8 = operator-(segment->a,&triangle->x);
    local_78.z = PVar8.z;
    local_78._0_8_ = PVar8._0_8_;
    local_58._0_4_ =
         ((float)local_58._0_4_ * local_78.z +
         (float)local_98._0_4_ * PVar8.x + (float)local_98._4_4_ * PVar8.y) * local_68;
    if ((0.0 <= (float)local_58._0_4_) && ((float)local_58._0_4_ <= 1.0)) {
      VVar9 = crossProduct(&local_78,&local_88);
      fVar7 = (local_40 * VVar9.z +
              (float)local_b8._0_4_ * VVar9.x + (float)local_b8._4_4_ * VVar9.y) * local_68;
      if ((0.0 <= fVar7) && ((float)local_58._0_4_ + fVar7 <= 1.0)) {
        local_68 = local_68 *
                   (local_3c * VVar9.z +
                   VVar9.x * (float)local_a8._0_4_ + VVar9.y * (float)local_a8._4_4_);
        if (0.0 < local_68) {
          uVar1 = (segment->a).x;
          uVar2 = (segment->a).y;
          fStack_2c = local_40 * local_68 + (segment->a).z;
          local_38 = CONCAT31(local_38._1_3_,1);
          uStack_34 = CONCAT44((float)uVar2 + (float)local_b8._4_4_ * local_68,
                               local_68 * (float)local_b8._0_4_ + (float)uVar1);
          goto LAB_00107d3d;
        }
      }
    }
    fStack_2c = 0.0;
    local_38 = local_38 & 0xffffff00;
    uStack_34 = 0;
  }
LAB_00107d3d:
  pVar3.second.x = (float)(undefined4)uStack_34;
  pVar3.second.y = (float)uStack_34._4_4_;
  pVar3._0_4_ = local_38;
  pVar3.second.z = fStack_2c;
  return pVar3;
}

Assistant:

std::pair<bool, Point> intersection(Segment const& segment, Triangle const& triangle)
{
  Vector const D = normalize(segment.b - segment.a);

  Vector e1 = triangle.y - triangle.x;
  Vector e2 = triangle.z - triangle.x;

  Vector P = crossProduct(D, e2);
  float det = dotProduct(e1, P);

  if (isCloseToZero(det))
    return {false, {}};

  float inv_det = 1.f / det;
  Vector T = segment.a - triangle.x;
  float u = dotProduct(T, P) * inv_det;
  if (u < 0.f || u > 1.f)
    return {false, {}};

  Vector Q = crossProduct(T, e1);
  float v = dotProduct(D, Q) * inv_det;

  if (v < 0.f || u + v > 1.f)
    return {false, {}};

  float t = dotProduct(e2, Q) * inv_det;
  if (t > 0)
  {
    Point res = segment.a + D * t;
    return {true, res};
  }

  return {false, {}};
}